

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstantExecution.h
# Opt level: O0

void nrg::InstantExecution::push<void(*)(int,std::__cxx11::string_const&),int&,char_const(&)[7]>
               (Queue *queue,
               _func_void_int_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
               *fn,int *param,char (*param_4) [7])

{
  long local_98;
  function<void_()> local_80;
  anon_class_24_3_7e084ec6 local_60;
  undefined1 local_48 [8];
  QueueElement elem;
  char (*param_local_1) [7];
  int *param_local;
  _func_void_int_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *fn_local;
  Queue *queue_local;
  
  local_60.param = *param;
  local_98 = 0;
  do {
    local_48[local_98 + -0xc] = (*param_4)[local_98];
    local_98 = local_98 + 1;
  } while (local_98 != 7);
  local_60.fn = fn;
  elem._M_invoker = (_Invoker_type)param_4;
  std::function<void()>::
  function<nrg::InstantExecution::push<void(*)(int,std::__cxx11::string_const&),int&,char_const(&)[7]>(std::queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>&,void(*)(int,std::__cxx11::string_const&),int&,char_const(&)[7])::_lambda()_1_,void>
            ((function<void()> *)local_48,&local_60);
  std::function<void_()>::function(&local_80,(function<void_()> *)local_48);
  push(queue,&local_80);
  std::function<void_()>::~function(&local_80);
  std::function<void_()>::~function((function<void_()> *)local_48);
  return;
}

Assistant:

static void push(Queue& queue, FN fn, Param&&... param)
    {
        QueueElement elem = [=]() { fn(param...); };
        push(queue, elem);
    }